

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

char * GetString(ConfigScanner *sc)

{
  byte firstbyte;
  byte *__src;
  size_t sVar1;
  char *pcVar2;
  byte *pbVar3;
  size_t __n;
  
  if (sc != (ConfigScanner *)0x0) {
    __src = (byte *)sc->ptr;
    pbVar3 = __src;
    while( true ) {
      firstbyte = *pbVar3;
      if ((((ulong)firstbyte < 0x3e) &&
          ((0x2800000d00002601U >> ((ulong)firstbyte & 0x3f) & 1) != 0)) || (firstbyte == 0x5d))
      break;
      sVar1 = GetUTF8Length(firstbyte);
      if (sVar1 == 0) {
        return (char *)0x0;
      }
      pbVar3 = pbVar3 + sVar1;
      sc->ptr = (char *)pbVar3;
    }
    __n = (long)pbVar3 - (long)__src;
    if (__n != 0) {
      pcVar2 = (char *)calloc(1,__n + 1);
      pcVar2 = strncpy(pcVar2,(char *)__src,__n);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

char *GetString(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return NULL;
	}
	char *start = sc->ptr;
	while (true)
	{
		char ch = *sc->ptr;
		if ((ch == ' ') || (ch == '\t'))
		{
			break;
		}
		if ((ch == '\r') || (ch == '\n') || (ch == '\0'))
		{
			break;
		}
		if ((ch == ']') | (ch == '=') || (ch == '"'))
		{
			break;
		}
		if ((ch == '#') || (ch == ';'))
		{
			break;
		}
		size_t step = GetUTF8Length(ch);
		if (step == 0)
		{
			return NULL;
		}
		sc->ptr += step;
	}
	size_t length = sc->ptr - start;
	if (length == 0)
	{
		return NULL;
	}
	char *temp = (char *)malloc(length + 1);
	memset(temp, '\0', length + 1);
	strncpy(temp, start, length);
	return temp;
}